

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_collection.cpp
# Opt level: O1

bool duckdb::ColumnDataCollection::ResultEquals
               (ColumnDataCollection *left,ColumnDataCollection *right,string *error_message,
               bool ordered)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> **pp_Var1;
  bool bVar2;
  iterator __it;
  char *pcVar3;
  char *pcVar4;
  idx_t iVar5;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1;
  idx_t index;
  bool bVar7;
  Value lvalue;
  Value rvalue;
  ColumnDataRowCollection left_rows;
  ColumnDataRowCollection right_rows;
  unsigned_long in_stack_fffffffffffffd48;
  undefined1 *local_290 [2];
  undefined1 local_280 [16];
  string local_270;
  Value local_250;
  string local_210;
  undefined1 local_1f0 [32];
  Value local_1d0;
  ColumnDataRowCollection local_190;
  ColumnDataRowCollection local_e0;
  
  if ((long)(left->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(left->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_start ==
      (long)(right->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(right->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_start) {
    if (left->count == right->count) {
      ColumnDataRowCollection::ColumnDataRowCollection(&local_190,left);
      ColumnDataRowCollection::ColumnDataRowCollection(&local_e0,right);
      if (left->count != 0) {
        params_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        do {
          if ((left->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              (left->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_start) {
            iVar5 = 0;
            do {
              ColumnDataRowCollection::GetValue(&local_250,&local_190,iVar5,(idx_t)params_1);
              ColumnDataRowCollection::GetValue(&local_1d0,&local_e0,iVar5,(idx_t)params_1);
              bVar2 = Value::DefaultValuesAreEqual(&local_250,&local_1d0);
              if (bVar2) {
                Value::~Value(&local_1d0);
                Value::~Value(&local_250);
              }
              else {
                local_290[0] = local_280;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_290,"%s <> %s (row: %lld, col: %lld)\n","");
                Value::ToString_abi_cxx11_(&local_270,&local_250);
                Value::ToString_abi_cxx11_(&local_210,&local_1d0);
                StringUtil::
                Format<std::__cxx11::string,std::__cxx11::string,unsigned_long,unsigned_long>
                          ((string *)local_1f0,(StringUtil *)local_290,&local_270,&local_210,
                           params_1,iVar5,in_stack_fffffffffffffd48);
                ::std::__cxx11::string::operator=((string *)error_message,(string *)local_1f0);
                if ((_Hashtable<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueResultEquals,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_false>_>
                     *)local_1f0._0_8_ !=
                    (_Hashtable<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueResultEquals,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_false>_>
                     *)(local_1f0 + 0x10)) {
                  operator_delete((void *)local_1f0._0_8_);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_210._M_dataplus._M_p != &local_210.field_2) {
                  operator_delete(local_210._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_270._M_dataplus._M_p != &local_270.field_2) {
                  operator_delete(local_270._M_dataplus._M_p);
                }
                if (local_290[0] != local_280) {
                  operator_delete(local_290[0]);
                }
                Value::~Value(&local_1d0);
                Value::~Value(&local_250);
                if (!bVar2) break;
              }
              iVar5 = iVar5 + 1;
            } while (iVar5 < (ulong)(((long)(left->types).
                                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                            .
                                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(left->types).
                                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                            .
                                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                    -0x5555555555555555));
          }
          if (error_message->_M_string_length != 0) {
            if (ordered) goto LAB_012ec49a;
            break;
          }
          params_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&(params_1->_M_dataplus)._M_p + 1);
        } while (params_1 <
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)left->count);
      }
      bVar2 = true;
      if (error_message->_M_string_length != 0) {
        if ((left->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            (left->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_start) {
          bVar2 = true;
          iVar5 = 0;
          do {
            local_1d0.type_._0_8_ = &local_1d0.value_info_;
            local_1d0.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)&DAT_00000001;
            local_1d0.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_1d0._24_8_ = 0;
            local_1d0.value_.integer = 0x3f800000;
            local_1d0.value_.hugeint.upper = 0;
            local_1d0.value_info_.internal.
            super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            if (left->count != 0) {
              index = 0;
              do {
                ColumnDataRowCollection::GetValue(&local_250,&local_190,iVar5,index);
                local_1f0._0_8_ =
                     (_Hashtable<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueResultEquals,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_false>_>
                      *)&local_1d0;
                ::std::
                _Hashtable<duckdb::Value,duckdb::Value,std::allocator<duckdb::Value>,std::__detail::_Identity,duckdb::ValueResultEquals,duckdb::ValueHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,false>>
                ::
                _M_insert<duckdb::Value_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::Value,true>>>>
                          ((_Hashtable<duckdb::Value,duckdb::Value,std::allocator<duckdb::Value>,std::__detail::_Identity,duckdb::ValueResultEquals,duckdb::ValueHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,false>>
                            *)&local_1d0,0,&local_250,local_1f0);
                Value::~Value(&local_250);
                index = index + 1;
              } while (index < left->count);
            }
            if (right->count != 0) {
              uVar6 = 1;
              do {
                ColumnDataRowCollection::GetValue(&local_250,&local_e0,iVar5,uVar6 - 1);
                __it = ::std::
                       _Hashtable<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueResultEquals,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_false>_>
                       ::find((_Hashtable<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueResultEquals,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_false>_>
                               *)&local_1d0,&local_250);
                if (__it.super__Node_iterator_base<duckdb::Value,_true>._M_cur == (__node_type *)0x0
                   ) {
                  bVar2 = false;
                }
                else {
                  ::std::
                  _Hashtable<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueResultEquals,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_false>_>
                  ::erase((_Hashtable<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueResultEquals,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_false>_>
                           *)&local_1d0,
                          (const_iterator)__it.super__Node_iterator_base<duckdb::Value,_true>._M_cur
                         );
                }
                Value::~Value(&local_250);
              } while ((__it.super__Node_iterator_base<duckdb::Value,_true>._M_cur !=
                        (__node_type *)0x0) &&
                      (bVar7 = uVar6 < right->count, uVar6 = uVar6 + 1, bVar7));
            }
            ::std::
            _Hashtable<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueResultEquals,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_false>_>
            ::~_Hashtable((_Hashtable<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueResultEquals,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_false>_>
                           *)&local_1d0);
          } while ((bVar2) &&
                  (iVar5 = iVar5 + 1,
                  iVar5 < (ulong)(((long)(left->types).
                                         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                         .
                                         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(left->types).
                                         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                         .
                                         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555)));
          if (!bVar2) {
LAB_012ec49a:
            bVar2 = false;
            goto LAB_012ec49d;
          }
        }
        bVar2 = true;
        pp_Var1 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)
                  &local_250.type_.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ;
        local_250.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_250.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_1_ = 0;
        local_250.type_._0_8_ = pp_Var1;
        ::std::__cxx11::string::operator=((string *)error_message,(string *)&local_250);
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_250.type_._0_8_ != pp_Var1) {
          operator_delete((void *)local_250.type_._0_8_);
        }
      }
LAB_012ec49d:
      if (local_e0.scan_state.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>
          .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e0.scan_state.column_ids.
                        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      ::std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&local_e0.scan_state);
      ::std::
      vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
      ::~vector(&local_e0.chunks.
                 super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
               );
      if (local_e0.rows.super_vector<duckdb::ColumnDataRow,_std::allocator<duckdb::ColumnDataRow>_>.
          super__Vector_base<duckdb::ColumnDataRow,_std::allocator<duckdb::ColumnDataRow>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e0.rows.
                        super_vector<duckdb::ColumnDataRow,_std::allocator<duckdb::ColumnDataRow>_>.
                        super__Vector_base<duckdb::ColumnDataRow,_std::allocator<duckdb::ColumnDataRow>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_190.scan_state.column_ids.
          super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_190.scan_state.column_ids.
                        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      ::std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&local_190.scan_state);
      ::std::
      vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
      ::~vector(&local_190.chunks.
                 super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
               );
      if (local_190.rows.super_vector<duckdb::ColumnDataRow,_std::allocator<duckdb::ColumnDataRow>_>
          .super__Vector_base<duckdb::ColumnDataRow,_std::allocator<duckdb::ColumnDataRow>_>._M_impl
          .super__Vector_impl_data._M_start == (pointer)0x0) {
        return bVar2;
      }
      operator_delete(local_190.rows.
                      super_vector<duckdb::ColumnDataRow,_std::allocator<duckdb::ColumnDataRow>_>.
                      super__Vector_base<duckdb::ColumnDataRow,_std::allocator<duckdb::ColumnDataRow>_>
                      ._M_impl.super__Vector_impl_data._M_start);
      return bVar2;
    }
    pcVar4 = (char *)error_message->_M_string_length;
    pcVar3 = "Row count mismatch";
  }
  else {
    pcVar4 = (char *)error_message->_M_string_length;
    pcVar3 = "Column count mismatch";
  }
  ::std::__cxx11::string::_M_replace((ulong)error_message,0,pcVar4,(ulong)pcVar3);
  return false;
}

Assistant:

bool ColumnDataCollection::ResultEquals(const ColumnDataCollection &left, const ColumnDataCollection &right,
                                        string &error_message, bool ordered) {
	if (left.ColumnCount() != right.ColumnCount()) {
		error_message = "Column count mismatch";
		return false;
	}
	if (left.Count() != right.Count()) {
		error_message = "Row count mismatch";
		return false;
	}
	auto left_rows = left.GetRows();
	auto right_rows = right.GetRows();
	for (idx_t r = 0; r < left.Count(); r++) {
		for (idx_t c = 0; c < left.ColumnCount(); c++) {
			auto lvalue = left_rows.GetValue(c, r);
			auto rvalue = right_rows.GetValue(c, r);

			if (!Value::DefaultValuesAreEqual(lvalue, rvalue)) {
				error_message =
				    StringUtil::Format("%s <> %s (row: %lld, col: %lld)\n", lvalue.ToString(), rvalue.ToString(), r, c);
				break;
			}
		}
		if (!error_message.empty()) {
			if (ordered) {
				return false;
			} else {
				break;
			}
		}
	}
	if (!error_message.empty()) {
		// do an unordered comparison
		bool found_all = true;
		for (idx_t c = 0; c < left.ColumnCount(); c++) {
			std::unordered_multiset<Value, ValueHashFunction, ValueResultEquals> lvalues;
			for (idx_t r = 0; r < left.Count(); r++) {
				auto lvalue = left_rows.GetValue(c, r);
				lvalues.insert(lvalue);
			}
			for (idx_t r = 0; r < right.Count(); r++) {
				auto rvalue = right_rows.GetValue(c, r);
				auto entry = lvalues.find(rvalue);
				if (entry == lvalues.end()) {
					found_all = false;
					break;
				}
				lvalues.erase(entry);
			}
			if (!found_all) {
				break;
			}
		}
		if (!found_all) {
			return false;
		}
		error_message = string();
	}
	return true;
}